

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O3

void __thiscall
DIS::MinefieldResponseNackPdu::MinefieldResponseNackPdu(MinefieldResponseNackPdu *this)

{
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldResponseNackPdu_001a08c8;
  EntityID::EntityID(&this->_minefieldID);
  EntityID::EntityID(&this->_requestingEntityID);
  this->_requestID = '\0';
  this->_numberOfMissingPdus = '\0';
  (this->_missingPduSequenceNumbers).
  super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_missingPduSequenceNumbers).
  super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_missingPduSequenceNumbers).
  super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'(');
  return;
}

Assistant:

MinefieldResponseNackPdu::MinefieldResponseNackPdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _requestingEntityID(), 
   _requestID(0), 
   _numberOfMissingPdus(0)
{
    setPduType( 40 );
}